

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.c
# Opt level: O2

void communicate(void *shared_memory,Arguments *args,Sync *sync)

{
  int iVar1;
  
  sync_notify(sync);
  puts("4");
  iVar1 = args->count;
  while (0 < iVar1) {
    sync_wait(sync);
    puts("5");
    memset(shared_memory,0x32,(long)args->size);
    puts("6");
    sync_notify(sync);
    puts("7");
    iVar1 = args->count + -1;
    args->count = iVar1;
  }
  return;
}

Assistant:

void communicate(void* shared_memory,
								 struct Arguments* args,
								 struct Sync* sync) {
	// Buffer into which to read data
	void* buffer = malloc(args->size);

	sync_notify(sync);

	printf("4\n");

	for (; args->count > 0; --args->count) {
		sync_wait(sync);

		printf("5\n");

		// Read from memory
		memcpy(buffer, shared_memory, args->size);
		// Write back
		memset(shared_memory, '2', args->size);

		printf("6\n");

		sync_notify(sync);

		printf("7\n");
	}

	free(buffer);
}